

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::Combine<duckdb::MinMaxState<float>,duckdb::MaxOperation>
               (Vector *source,Vector *target,AggregateInputData *aggr_input_data,idx_t count)

{
  MinMaxState<float> *source_00;
  MinMaxState<float> *in_RCX;
  idx_t i;
  MinMaxState<float> **tdata;
  MinMaxState<float> **sdata;
  MinMaxState<float> *target_00;
  
  FlatVector::GetData<duckdb::MinMaxState<float>const*>((Vector *)0xfb6c72);
  source_00 = (MinMaxState<float> *)
              FlatVector::GetData<duckdb::MinMaxState<float>*>((Vector *)0xfb6c81);
  for (target_00 = (MinMaxState<float> *)0x0; target_00 < in_RCX;
      target_00 = (MinMaxState<float> *)((long)&target_00->value + 1)) {
    MaxOperation::Combine<duckdb::MinMaxState<float>,duckdb::MaxOperation>
              (source_00,target_00,(AggregateInputData *)0xfb6cbd);
  }
  return;
}

Assistant:

static void Combine(Vector &source, Vector &target, AggregateInputData &aggr_input_data, idx_t count) {
		D_ASSERT(source.GetType().id() == LogicalTypeId::POINTER && target.GetType().id() == LogicalTypeId::POINTER);
		auto sdata = FlatVector::GetData<const STATE_TYPE *>(source);
		auto tdata = FlatVector::GetData<STATE_TYPE *>(target);

		for (idx_t i = 0; i < count; i++) {
			OP::template Combine<STATE_TYPE, OP>(*sdata[i], *tdata[i], aggr_input_data);
		}
	}